

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncDecVerify.cpp
# Opt level: O2

void incdec_verify::PreDecTestUint32(void)

{
  bool expected;
  uint t;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *pSVar1;
  long lVar2;
  allocator local_51;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  
  for (lVar2 = 8; lVar2 != 0x74; lVar2 = lVar2 + 0xc) {
    t = *(uint *)(&UNK_00159df8 + lVar2);
    si.m_int = t;
    pSVar1 = SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             ::operator--(&si);
    expected = *(bool *)((long)&dec_uint32 + lVar2);
    if ((pSVar1->m_int == *(uint *)(&UNK_00159dfc + lVar2)) != expected) {
      std::__cxx11::string::string((string *)&si,"Error in case dec_uint32 throw (1): ",&local_51);
      err_msg<unsigned_int>((string *)&si,t,expected);
      std::__cxx11::string::~string((string *)&si);
    }
  }
  return;
}

Assistant:

void PreDecTestUint32()
{
	size_t i;

	for( i = 0; i < COUNTOF(dec_uint32); ++i )
	{
		bool fSuccess = true;
		try
		{
			SafeInt<std::uint32_t> si(dec_uint32[i].x);
			SafeInt<std::uint32_t> vv = --si;

			if(vv != dec_uint32[i].y)
			{
				fSuccess = false;
			}
		}
		catch(SafeIntException&)
		{
			fSuccess = false;
		}

		if( fSuccess != dec_uint32[i].fExpected )
		{
			err_msg( "Error in case dec_uint32 throw (1): ", dec_uint32[i].x, dec_uint32[i].fExpected );
		}
	}
}